

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geodesic.cpp
# Opt level: O2

string * __thiscall Geodesic::toString_abi_cxx11_(string *__return_storage_ptr__,Geodesic *this)

{
  ostream *poVar1;
  double dVar2;
  ostringstream ss;
  RatioSequence local_1d0;
  string local_1b0;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  dVar2 = getDist(this);
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  poVar1 = std::operator<<(poVar1,"; ");
  RatioSequence::getNonDesRSWithMinDist(&local_1d0,&this->rs);
  RatioSequence::toString_abi_cxx11_(&local_1b0,&local_1d0);
  std::operator<<(poVar1,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::vector<Ratio,_std::allocator<Ratio>_>::~vector(&local_1d0._RatioSequence);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

string Geodesic::toString() {
    ostringstream ss;
    ss << getDist() << "; " << rs.getNonDesRSWithMinDist().toString();
    return ss.str();
}